

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O2

size_t enet_range_coder_decompress
                 (void *context,enet_uint8 *inData,size_t inLimit,enet_uint8 *outData,
                 size_t outLimit)

{
  undefined8 *puVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  short sVar5;
  enet_uint16 eVar6;
  uint uVar7;
  uint uVar8;
  ushort uVar9;
  short sVar10;
  ushort uVar11;
  uint uVar12;
  ushort *puVar13;
  uint uVar14;
  int iVar15;
  int iVar17;
  ulong uVar18;
  undefined8 *puVar19;
  ENetSymbol *pEVar20;
  byte bVar21;
  uint uVar22;
  uint uVar23;
  ENetSymbol *pEVar24;
  ushort uVar25;
  uint uVar26;
  long lVar27;
  undefined8 *puVar28;
  ulong uVar29;
  ushort *puVar30;
  undefined8 *puVar31;
  ulong uStack_90;
  enet_uint16 predicted;
  uint local_7c;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  undefined8 *local_60;
  byte *local_58;
  ENetSymbol *local_50;
  byte *local_48;
  byte *local_40;
  enet_uint8 *local_38;
  ulong uVar16;
  
  predicted = 0;
  uVar7 = 0;
  if (inLimit == 0 || context == (void *)0x0) {
    return 0;
  }
  local_58 = inData + inLimit;
  *(undefined8 *)context = 0;
  *(undefined8 *)((long)context + 8) = 0;
  *(undefined4 *)((long)context + 10) = 0x1010001;
  if (0 < (long)inLimit) {
    bVar21 = *inData;
    inData = inData + 1;
    uVar7 = (uint)bVar21 << 0x18;
  }
  if (inData < local_58) {
    bVar21 = *inData;
    inData = inData + 1;
    uVar7 = (uint)bVar21 << 0x10 | uVar7;
  }
  if (inData < local_58) {
    bVar21 = *inData;
    inData = inData + 1;
    uVar7 = (uint)bVar21 << 8 | uVar7;
  }
  if (inData < local_58) {
    bVar21 = *inData;
    inData = inData + 1;
    uVar7 = uVar7 | bVar21;
  }
  local_48 = outData + outLimit;
  uStack_90 = 1;
  uVar16 = 0xffffffffffffffff;
  local_68 = 0;
  pEVar24 = (ENetSymbol *)0x0;
  local_38 = outData;
  local_60 = (undefined8 *)context;
LAB_00102d71:
  puVar30 = &predicted;
  uVar18 = (ulong)pEVar24 & 0xffffffff;
  while( true ) {
    uVar3 = *puVar30;
    iVar17 = (int)uVar18;
    if (uVar3 == 0) break;
    uVar25 = *(ushort *)((long)context + (ulong)uVar3 * 0x10 + 10);
    if (uVar25 != 0) {
      uVar4 = *(ushort *)((long)context + (ulong)uVar3 * 0x10 + 0xc);
      if (uVar25 < uVar4) {
        uVar16 = (uVar16 & 0xffffffff) / (ulong)uVar4;
        uVar8 = (uint)((uVar7 - iVar17) / uVar16);
        uVar14 = (uint)uVar25;
        iVar15 = (int)uVar16;
        if ((uVar8 & 0xffff) < uVar14) {
          uVar14 = iVar15 * uVar14;
          do {
            uVar16 = (ulong)uVar14;
            uVar8 = (uint)uVar18;
            if (0xffffff < (uVar8 + uVar14 ^ uVar8)) {
              if (0xffff < uVar14) goto LAB_00102dff;
              uVar14 = -uVar8 & 0xffff;
            }
            uVar7 = uVar7 << 8;
            if (inData < local_58) {
              bVar21 = *inData;
              inData = inData + 1;
              uVar7 = uVar7 | bVar21;
            }
            uVar14 = uVar14 << 8;
            uVar18 = (ulong)(uVar8 << 8);
          } while( true );
        }
        if (*(ushort *)((long)context + ((ulong)uVar3 * 2 + 1) * 8) == 0) {
          return 0;
        }
        uVar8 = uVar8 - uVar14;
        local_50 = (ENetSymbol *)
                   ((long)context +
                   ((ulong)uVar3 * 2 +
                   (ulong)*(ushort *)((long)context + ((ulong)uVar3 * 2 + 1) * 8) * 2) * 8);
        pEVar20 = local_50;
        uVar25 = 0;
        goto LAB_00102f30;
      }
    }
LAB_00102dff:
    puVar30 = (ushort *)((long)context + (ulong)uVar3 * 0x10 + 0xe);
  }
  uVar16 = (uVar16 & 0xffffffff) / (ulong)*(ushort *)((long)context + 0xc);
  uVar8 = (uint)((uVar7 - iVar17) / uVar16);
  uVar3 = *(ushort *)((long)context + 10);
  iVar15 = (int)uVar16;
  if ((uVar8 & 0xffff) < (uint)uVar3) {
    uVar7 = iVar15 * (uint)uVar3;
    do {
      uVar8 = (uint)uVar18;
      if (0xffffff < (uVar8 + uVar7 ^ uVar8)) {
        if (0xffff < uVar7) {
          return (long)outData - (long)local_38;
        }
        uVar7 = -uVar8 & 0xffff;
      }
      uVar7 = uVar7 << 8;
      uVar18 = (ulong)(uVar8 << 8);
    } while( true );
  }
  uVar8 = uVar8 - uVar3;
  local_40 = outData;
  if (*(ushort *)((long)context + 8) != 0) {
    pEVar20 = (ENetSymbol *)((long)context + (ulong)*(ushort *)((long)context + 8) * 2 * 8);
    uVar12 = uVar8 & 0xffff;
    uVar14 = 0;
    do {
      uVar3 = pEVar20->under;
      uVar23 = (uVar14 & 0xffff) + (uint)uVar3;
      bVar21 = pEVar20->value;
      local_70 = (ulong)bVar21;
      uVar26 = bVar21 + uVar23 + 1;
      uVar22 = uVar26 & 0xffff;
      if (uVar12 < uVar22) {
        bVar2 = pEVar20->count;
        uVar22 = uVar22 + ~(uint)bVar2;
        if ((int)uVar22 <= (int)uVar12) {
          uVar14 = bVar2 + 1;
          pEVar20->under = uVar3 + 3;
          pEVar20->count = bVar2 + 3;
          local_78 = uStack_90;
          goto LAB_00103033;
        }
        pEVar20->under = uVar3 + 3;
        eVar6 = pEVar20->left;
        if (eVar6 == 0) goto LAB_00102feb;
      }
      else {
        eVar6 = pEVar20->right;
        uVar14 = uVar23;
        if (eVar6 == 0) {
          uVar26 = (bVar21 + 1 + uVar12) - uVar26;
          local_70 = (ulong)uVar26;
          lVar27 = uStack_90 * 0x10;
          pEVar24 = (ENetSymbol *)((long)context + uStack_90 * 2 * 8);
          *(char *)((long)context + uStack_90 * 2 * 8) = (char)uVar26;
          *(undefined1 *)((long)context + lVar27 + 1) = 3;
          *(undefined2 *)((long)context + lVar27 + 2) = 3;
          *(undefined8 *)((long)context + lVar27 + 4) = 0;
          *(undefined4 *)((long)context + lVar27 + 0xc) = 0;
          pEVar20->right = (enet_uint16)((uint)((int)pEVar24 - (int)pEVar20) >> 4);
          local_78 = uStack_90;
          goto LAB_00103030;
        }
      }
      pEVar20 = pEVar20 + eVar6;
    } while( true );
  }
  lVar27 = uStack_90 * 0x10;
  *(char *)((long)context + uStack_90 * 2 * 8) = (char)uVar8;
  *(undefined1 *)((long)context + lVar27 + 1) = 3;
  *(undefined2 *)((long)context + lVar27 + 2) = 3;
  *(undefined8 *)((long)context + lVar27 + 4) = 0;
  *(undefined4 *)((long)context + lVar27 + 0xc) = 0;
  *(short *)((long)context + 8) = (short)uStack_90;
  pEVar24 = (ENetSymbol *)((long)context + uStack_90 * 2 * 8);
  local_70 = (ulong)uVar8;
  goto LAB_00103030;
LAB_00102feb:
  bVar21 = bVar21 + ((char)uVar12 - (char)uVar22);
  local_70 = (ulong)bVar21;
  lVar27 = uStack_90 * 0x10;
  pEVar24 = (ENetSymbol *)((long)context + uStack_90 * 2 * 8);
  *(byte *)((long)context + uStack_90 * 2 * 8) = bVar21;
  *(undefined1 *)((long)context + lVar27 + 1) = 3;
  *(undefined2 *)((long)context + lVar27 + 2) = 3;
  *(undefined8 *)((long)context + lVar27 + 4) = 0;
  *(undefined4 *)((long)context + lVar27 + 0xc) = 0;
  pEVar20->left = (enet_uint16)((uint)((int)pEVar24 - (int)pEVar20) >> 4);
  local_78 = uStack_90;
LAB_00103030:
  uStack_90 = uStack_90 + 1;
  uVar14 = 1;
  pEVar20 = pEVar24;
  uVar22 = uVar8;
LAB_00103033:
  uVar3 = *(ushort *)((long)context + 10);
  uVar12 = ((uVar22 & 0xffff) + (uint)uVar3) * iVar15 + iVar17;
  uVar8 = iVar15 * uVar14;
  do {
    if (0xffffff < (uVar12 + uVar8 ^ uVar12)) {
      if (0xffff < uVar8) break;
      uVar8 = -uVar12 & 0xffff;
    }
    uVar7 = uVar7 << 8;
    if (inData < local_58) {
      bVar21 = *inData;
      inData = inData + 1;
      uVar7 = uVar7 | bVar21;
    }
    uVar8 = uVar8 << 8;
    uVar12 = uVar12 << 8;
  } while( true );
  uVar25 = *(short *)((long)context + 0xc) + 3;
  *(ushort *)((long)context + 0xc) = uVar25;
  if (0xff00 < uVar25 || 0xfa < uVar14) {
    if (*(ushort *)((long)context + 8) == 0) {
      sVar5 = 0x100;
    }
    else {
      eVar6 = enet_symbol_rescale((ENetSymbol *)
                                  ((long)context + (ulong)*(ushort *)((long)context + 8) * 2 * 8));
      uVar3 = *(ushort *)((long)local_60 + 10);
      sVar5 = eVar6 + 0x100;
      context = local_60;
    }
    sVar10 = uVar3 - (uVar3 >> 1);
    *(short *)((long)context + 10) = sVar10;
    *(short *)((long)context + 0xc) = sVar5 + sVar10;
  }
  puVar28 = (undefined8 *)context;
  local_7c = 0;
LAB_001030fc:
  pEVar24 = (ENetSymbol *)(ulong)uVar12;
  uVar16 = (ulong)uVar8;
  uVar29 = (ulong)((long)pEVar20 - (long)puVar28) >> 4;
  puVar30 = &predicted;
  local_78 = uVar29;
  local_50 = pEVar24;
  puVar13 = puVar30;
  uVar18 = local_70;
  uVar8 = local_7c;
  while( true ) {
    uVar3 = *puVar13;
    bVar21 = (byte)uVar18;
    if (uVar3 == (ushort)uVar8) break;
    puVar1 = puVar28 + (ulong)uVar3 * 2;
    uVar25 = *(ushort *)(puVar1 + 1);
    puVar19 = puVar1;
    if (uVar25 == 0) {
      lVar27 = uStack_90 * 0x10;
      *(byte *)(puVar28 + uStack_90 * 2) = bVar21;
      *(undefined1 *)((long)puVar28 + lVar27 + 1) = 2;
      *(undefined2 *)((long)puVar28 + lVar27 + 2) = 2;
      *(undefined8 *)((long)puVar28 + lVar27 + 4) = 0;
      *(undefined4 *)((long)puVar28 + lVar27 + 0xc) = 0;
      puVar31 = puVar28 + uStack_90 * 2;
      *(short *)(puVar28 + (ulong)uVar3 * 2 + 1) = (short)((int)lVar27 + (uint)uVar3 * -0x10 >> 4);
      bVar21 = 0;
      uStack_90 = uStack_90 + 1;
    }
    else {
      do {
        while( true ) {
          puVar31 = puVar19 + (ulong)uVar25 * 2;
          if (*(byte *)(puVar19 + (ulong)uVar25 * 2) <= bVar21) break;
          *(short *)((long)puVar31 + 2) = *(short *)((long)puVar31 + 2) + 2;
          uVar25 = *(ushort *)((long)puVar31 + 4);
          puVar19 = puVar31;
          if (uVar25 == 0) {
            lVar27 = uStack_90 * 0x10;
            puVar19 = puVar28 + uStack_90 * 2;
            *(byte *)(puVar28 + uStack_90 * 2) = bVar21;
            *(undefined1 *)((long)puVar28 + lVar27 + 1) = 2;
            *(undefined2 *)((long)puVar28 + lVar27 + 2) = 2;
            *(undefined8 *)((long)puVar28 + lVar27 + 4) = 0;
            *(undefined4 *)((long)puVar28 + lVar27 + 0xc) = 0;
            *(short *)((long)puVar31 + 4) = (short)((uint)((int)puVar19 - (int)puVar31) >> 4);
            goto LAB_00103223;
          }
        }
        if (bVar21 <= *(byte *)(puVar19 + (ulong)uVar25 * 2)) {
          bVar21 = *(byte *)((long)puVar31 + 1);
          *(short *)((long)puVar31 + 2) = *(short *)((long)puVar31 + 2) + 2;
          *(byte *)((long)puVar31 + 1) = bVar21 + 2;
          goto LAB_0010323f;
        }
        uVar25 = *(ushort *)((long)puVar31 + 6);
        puVar19 = puVar31;
      } while (uVar25 != 0);
      lVar27 = uStack_90 * 0x10;
      puVar19 = puVar28 + uStack_90 * 2;
      *(byte *)(puVar28 + uStack_90 * 2) = bVar21;
      *(undefined1 *)((long)puVar28 + lVar27 + 1) = 2;
      *(undefined2 *)((long)puVar28 + lVar27 + 2) = 2;
      *(undefined8 *)((long)puVar28 + lVar27 + 4) = 0;
      *(undefined4 *)((long)puVar28 + lVar27 + 0xc) = 0;
      *(short *)((long)puVar31 + 6) = (short)((uint)((int)puVar19 - (int)puVar31) >> 4);
LAB_00103223:
      bVar21 = 0;
      uStack_90 = uStack_90 + 1;
      puVar31 = puVar19;
    }
LAB_0010323f:
    *puVar30 = (ushort)((uint)((int)puVar31 - (int)puVar28) >> 4);
    if (bVar21 == 0) {
      *(short *)((long)puVar1 + 10) = *(short *)((long)puVar1 + 10) + 5;
      sVar5 = *(short *)((long)puVar1 + 0xc) + 5;
    }
    else {
      sVar5 = *(short *)((long)puVar1 + 0xc);
    }
    *(ushort *)((long)puVar1 + 0xc) = sVar5 + 2U;
    if ((0xfb < bVar21) || (0xff00 < (ushort)(sVar5 + 2U))) {
      if (*(ushort *)(puVar1 + 1) == 0) {
        eVar6 = 0;
      }
      else {
        eVar6 = enet_symbol_rescale((ENetSymbol *)(puVar1 + (ulong)*(ushort *)(puVar1 + 1) * 2));
        uVar18 = local_70;
        pEVar24 = local_50;
        puVar28 = local_60;
        uVar29 = local_78;
      }
      sVar5 = *(ushort *)((long)puVar1 + 10) - (*(ushort *)((long)puVar1 + 10) >> 1);
      *(short *)((long)puVar1 + 10) = sVar5;
      *(enet_uint16 *)((long)puVar1 + 0xc) = eVar6 + sVar5;
      uVar8 = local_7c;
    }
    puVar30 = (ushort *)((long)puVar31 + 0xe);
    puVar13 = (ushort *)((long)puVar1 + 0xe);
  }
  *puVar30 = (ushort)uVar29;
  if (local_48 <= local_40) {
    return 0;
  }
  *local_40 = bVar21;
  if (local_68 < 2) {
    local_68 = local_68 + 1;
  }
  else {
    predicted = *(enet_uint16 *)((long)puVar28 + (ulong)predicted * 0x10 + 0xe);
    local_68 = 2;
  }
  outData = local_40 + 1;
  context = puVar28;
  if (0xffd < uStack_90) {
    *puVar28 = 0;
    puVar28[1] = 0;
    *(undefined4 *)((long)puVar28 + 10) = 0x1010001;
    predicted = 0;
    local_68 = 0;
    uStack_90 = 1;
  }
  goto LAB_00102d71;
LAB_00102f30:
  eVar6 = pEVar20->under;
  uVar11 = uVar25 + eVar6;
  if ((ushort)uVar8 < uVar11) {
    bVar21 = pEVar20->count;
    uVar12 = (uint)uVar11 - (uint)bVar21;
    if ((int)uVar12 <= (int)(uVar8 & 0xffff)) goto LAB_00103356;
    pEVar20->under = eVar6 + 2;
    uVar9 = pEVar20->left;
    uVar11 = uVar25;
  }
  else {
    uVar9 = pEVar20->right;
  }
  if (uVar9 == 0) {
    return 0;
  }
  pEVar20 = pEVar20 + uVar9;
  uVar25 = uVar11;
  goto LAB_00102f30;
LAB_00103356:
  local_40 = outData;
  local_70 = (ulong)CONCAT31((int3)(uVar8 >> 8),pEVar20->value);
  pEVar20->under = eVar6 + 2;
  pEVar20->count = bVar21 + 2;
  uVar12 = ((uVar12 & 0xffff) + uVar14) * iVar15 + iVar17;
  uVar8 = iVar15 * (uint)bVar21;
  do {
    if (0xffffff < (uVar12 + uVar8 ^ uVar12)) {
      if (0xffff < uVar8) break;
      uVar8 = -uVar12 & 0xffff;
    }
    uVar7 = uVar7 << 8;
    if (inData < local_58) {
      bVar2 = *inData;
      inData = inData + 1;
      uVar7 = uVar7 | bVar2;
    }
    uVar8 = uVar8 << 8;
    uVar12 = uVar12 << 8;
  } while( true );
  *(ushort *)((long)context + (ulong)uVar3 * 0x10 + 0xc) = uVar4 + 2;
  local_7c = (uint)uVar3;
  if ((0xff00 < (ushort)(uVar4 + 2)) || (puVar28 = local_60, 0xfb < bVar21)) {
    local_78 = uStack_90;
    eVar6 = enet_symbol_rescale(local_50);
    uVar25 = *(ushort *)((long)context + (ulong)uVar3 * 0x10 + 10);
    sVar5 = uVar25 - (uVar25 >> 1);
    *(short *)((long)context + (ulong)uVar3 * 0x10 + 10) = sVar5;
    *(enet_uint16 *)((long)context + (ulong)uVar3 * 0x10 + 0xc) = sVar5 + eVar6;
    uStack_90 = local_78;
    puVar28 = local_60;
  }
  goto LAB_001030fc;
}

Assistant:

size_t
enet_range_coder_decompress (void * context, const enet_uint8 * inData, size_t inLimit, enet_uint8 * outData, size_t outLimit)
{
    ENetRangeCoder * rangeCoder = (ENetRangeCoder *) context;
    enet_uint8 * outStart = outData, * outEnd = & outData [outLimit];
    const enet_uint8 * inEnd = & inData [inLimit];
    enet_uint32 decodeLow = 0, decodeCode = 0, decodeRange = ~0;
    ENetSymbol * root;
    enet_uint16 predicted = 0;
    size_t order = 0, nextSymbol = 0;
#ifdef ENET_CONTEXT_EXCLUSION
    ENetExclude excludes [256];
    ENetExclude * nextExclude = excludes;
#endif
  
    if (rangeCoder == NULL || inLimit <= 0)
      return 0;

    ENET_CONTEXT_CREATE (root, ENET_CONTEXT_ESCAPE_MINIMUM, ENET_CONTEXT_SYMBOL_MINIMUM);

    ENET_RANGE_CODER_SEED;

    for (;;)
    {
        ENetSymbol * subcontext, * symbol, * patch;
#ifdef ENET_CONTEXT_EXCLUSION
        const ENetSymbol * childContext = & emptyContext;
#endif
        enet_uint8 value = 0;
        enet_uint16 code, under, count, bottom, * parent = & predicted, total;

        for (subcontext = & rangeCoder -> symbols [predicted];
             subcontext != root;
#ifdef ENET_CONTEXT_EXCLUSION
             childContext = subcontext, 
#endif
                subcontext = & rangeCoder -> symbols [subcontext -> parent])
        {
            if (subcontext -> escapes <= 0)
              continue;
            total = subcontext -> total;
#ifdef ENET_CONTEXT_EXCLUSION
            if (childContext -> total > 0) 
              ENET_CONTEXT_DECODE_EXCLUDE (childContext, total, 0); 
#endif
            if (subcontext -> escapes >= total)
              continue;
            code = ENET_RANGE_CODER_READ (total);
            if (code < subcontext -> escapes) 
            {
                ENET_RANGE_CODER_DECODE (0, subcontext -> escapes, total); 
                continue;
            }
            code -= subcontext -> escapes;
#ifdef ENET_CONTEXT_EXCLUSION
            if (childContext -> total > 0)
            {
                ENET_CONTEXT_TRY_DECODE (subcontext, symbol, code, value, under, count, ENET_SUBCONTEXT_SYMBOL_DELTA, 0, ENET_CONTEXT_EXCLUDED); 
            }
            else
#endif
            {
                ENET_CONTEXT_TRY_DECODE (subcontext, symbol, code, value, under, count, ENET_SUBCONTEXT_SYMBOL_DELTA, 0, ENET_CONTEXT_NOT_EXCLUDED); 
            }
            bottom = symbol - rangeCoder -> symbols;
            ENET_RANGE_CODER_DECODE (subcontext -> escapes + under, count, total);
            subcontext -> total += ENET_SUBCONTEXT_SYMBOL_DELTA;
            if (count > 0xFF - 2*ENET_SUBCONTEXT_SYMBOL_DELTA || subcontext -> total > ENET_RANGE_CODER_BOTTOM - 0x100)
              ENET_CONTEXT_RESCALE (subcontext, 0);
            goto patchContexts;
        }

        total = root -> total;
#ifdef ENET_CONTEXT_EXCLUSION
        if (childContext -> total > 0)
          ENET_CONTEXT_DECODE_EXCLUDE (childContext, total, ENET_CONTEXT_SYMBOL_MINIMUM);  
#endif
        code = ENET_RANGE_CODER_READ (total);
        if (code < root -> escapes)
        {
            ENET_RANGE_CODER_DECODE (0, root -> escapes, total);
            break;
        }
        code -= root -> escapes;
#ifdef ENET_CONTEXT_EXCLUSION
        if (childContext -> total > 0)
        {
            ENET_CONTEXT_ROOT_DECODE (root, symbol, code, value, under, count, ENET_CONTEXT_SYMBOL_DELTA, ENET_CONTEXT_SYMBOL_MINIMUM, ENET_CONTEXT_EXCLUDED); 
        }
        else
#endif
        {
            ENET_CONTEXT_ROOT_DECODE (root, symbol, code, value, under, count, ENET_CONTEXT_SYMBOL_DELTA, ENET_CONTEXT_SYMBOL_MINIMUM, ENET_CONTEXT_NOT_EXCLUDED); 
        }
        bottom = symbol - rangeCoder -> symbols;
        ENET_RANGE_CODER_DECODE (root -> escapes + under, count, total);
        root -> total += ENET_CONTEXT_SYMBOL_DELTA;
        if (count > 0xFF - 2*ENET_CONTEXT_SYMBOL_DELTA + ENET_CONTEXT_SYMBOL_MINIMUM || root -> total > ENET_RANGE_CODER_BOTTOM - 0x100)
          ENET_CONTEXT_RESCALE (root, ENET_CONTEXT_SYMBOL_MINIMUM);

    patchContexts:
        for (patch = & rangeCoder -> symbols [predicted];
             patch != subcontext;
             patch = & rangeCoder -> symbols [patch -> parent])
        {
            ENET_CONTEXT_ENCODE (patch, symbol, value, under, count, ENET_SUBCONTEXT_SYMBOL_DELTA, 0);
            * parent = symbol - rangeCoder -> symbols;
            parent = & symbol -> parent;
            if (count <= 0)
            {
                patch -> escapes += ENET_SUBCONTEXT_ESCAPE_DELTA;
                patch -> total += ENET_SUBCONTEXT_ESCAPE_DELTA;
            }
            patch -> total += ENET_SUBCONTEXT_SYMBOL_DELTA; 
            if (count > 0xFF - 2*ENET_SUBCONTEXT_SYMBOL_DELTA || patch -> total > ENET_RANGE_CODER_BOTTOM - 0x100)
              ENET_CONTEXT_RESCALE (patch, 0);
        }
        * parent = bottom;

        ENET_RANGE_CODER_OUTPUT (value);

        if (order >= ENET_SUBCONTEXT_ORDER)
          predicted = rangeCoder -> symbols [predicted].parent;
        else
          order ++;
        ENET_RANGE_CODER_FREE_SYMBOLS;
    }
                        
    return (size_t) (outData - outStart);
}